

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
SpiSimulationDataGenerator::GenerateSimulationData
          (SpiSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  SimulationChannelDescriptor *pSVar4;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar2 <= uVar3) break;
    CreateSpiTransaction(this);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x20);
  }
  pSVar4 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar4;
  UVar1 = SimulationChannelDescriptorGroup::GetCount();
  return UVar1;
}

Assistant:

U32 SpiSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                        SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mClock->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        CreateSpiTransaction();

        mSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }

    *simulation_channels = mSpiSimulationChannels.GetArray();
    return mSpiSimulationChannels.GetCount();
}